

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O0

SimpleString BracketsFormattedHexString(SimpleString *hexString)

{
  size_t extraout_RDX;
  SimpleString *in_RDI;
  SimpleString SVar1;
  char *in_stack_ffffffffffffff88;
  SimpleString *this;
  SimpleString *in_stack_ffffffffffffffb0;
  SimpleString *in_stack_ffffffffffffffb8;
  
  this = in_RDI;
  SimpleString::SimpleString(in_RDI,in_stack_ffffffffffffff88);
  SimpleString::operator+(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  SimpleString::SimpleString(this,in_stack_ffffffffffffff88);
  SimpleString::operator+(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  SimpleString::~SimpleString((SimpleString *)0x10fc2f);
  SimpleString::~SimpleString((SimpleString *)0x10fc39);
  SimpleString::~SimpleString((SimpleString *)0x10fc43);
  SVar1.bufferSize_ = extraout_RDX;
  SVar1.buffer_ = (char *)in_RDI;
  return SVar1;
}

Assistant:

SimpleString BracketsFormattedHexString(SimpleString hexString)
{
    return SimpleString("(0x") + hexString + ")" ;
}